

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::Value::display(Value *this,ostream *o)

{
  bool bVar1;
  add_pointer_t<const_mir::inst::VarId> ptVar2;
  ostream *poVar3;
  add_pointer_t<const_int> ptVar4;
  ostream *in_RSI;
  Displayable *in_RDI;
  add_pointer_t<const_int> x_1;
  add_pointer_t<const_mir::inst::VarId> x;
  Value *in_stack_ffffffffffffffe0;
  
  ptVar2 = std::get_if<mir::inst::VarId,int,mir::inst::VarId>
                     ((variant<int,_mir::inst::VarId> *)0x2bddd0);
  if (ptVar2 == (add_pointer_t<const_mir::inst::VarId>)0x0) {
    ptVar4 = std::get_if<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x2bde81);
    if (ptVar4 != (add_pointer_t<const_int>)0x0) {
      std::ostream::operator<<(in_RSI,*ptVar4);
    }
  }
  else {
    bVar1 = has_shift(in_stack_ffffffffffffffe0);
    if (bVar1) {
      std::operator<<(in_RSI,"(");
    }
    prelude::operator<<((ostream *)in_stack_ffffffffffffffe0,in_RDI);
    bVar1 = has_shift(in_stack_ffffffffffffffe0);
    if (bVar1) {
      std::operator<<(in_RSI,", ");
      arm::display_shift((ostream *)in_stack_ffffffffffffffe0,
                         (RegisterShiftKind)((ulong)in_RDI >> 0x38));
      poVar3 = std::operator<<(in_RSI," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(uint)*(byte *)((long)&in_RDI[3]._vptr_Displayable + 2));
      std::operator<<(poVar3,")");
    }
  }
  return;
}

Assistant:

void Value::display(std::ostream& o) const {
  if (auto x = std::get_if<VarId>(this)) {
    if (has_shift()) {
      o << "(";
    }
    o << *x;
    if (has_shift()) {
      o << ", ";
      arm::display_shift(o, shift);
      o << " " << (unsigned int)shift_amount << ")";
    }
  } else if (auto x = std::get_if<int32_t>(this)) {
    o << *x;
  }
}